

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9CachePolicyULT.cpp
# Opt level: O0

void CTestGen9CachePolicy::SetUpTestCase(void)

{
  CommonULT::GfxPlatform.eProductFamily = IGFX_SKYLAKE;
  CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_GEN9_CORE;
  CommonULT::AllocateAdapterInfo();
  (CommonULT::pGfxAdapterInfo->SystemInfo).L3CacheSizeInKb = 0x300;
  (CommonULT::pGfxAdapterInfo->SystemInfo).LLCCacheSizeInKb = 0x800;
  (CommonULT::pGfxAdapterInfo->SystemInfo).EdramSizeInKb = 0x20000;
  (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
       (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
       ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xfffffffffffffdff | 0x200);
  CommonULT::SetUpTestCase();
  printf("%s\n","SetUpTestCase");
  return;
}

Assistant:

void CTestGen9CachePolicy::SetUpTestCase()
{
    GfxPlatform.eProductFamily    = IGFX_SKYLAKE;
    GfxPlatform.eRenderCoreFamily = IGFX_GEN9_CORE;

    AllocateAdapterInfo();

    pGfxAdapterInfo->SystemInfo.L3CacheSizeInKb                         = 768;
    pGfxAdapterInfo->SystemInfo.LLCCacheSizeInKb                        = 2 * 1024;   //2 MB
    pGfxAdapterInfo->SystemInfo.EdramSizeInKb                           = 128 * 1024; //128 MB
    const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrEDram = 1;

    CommonULT::SetUpTestCase();

    printf("%s\n", __FUNCTION__);
}